

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>
                   (string *__return_storage_ptr__,int *a,char (*b) [3],char **args,
                   char (*args_1) [2])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_180;
  cmAlphaNum local_148;
  cmAlphaNum local_110;
  cmAlphaNum local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_58;
  iterator local_40;
  undefined8 local_38;
  char (*local_30) [2];
  char (*args_local_1) [2];
  char **args_local;
  char (*b_local) [3];
  int *a_local;
  
  local_30 = args_1;
  args_local_1 = (char (*) [2])args;
  args_local = (char **)b;
  b_local = (char (*) [3])a;
  a_local = (int *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_d8,*a);
  cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>(int&&,char_const(&)[3],char_const*&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_a0,
             &cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>(int&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_d8);
  cmAlphaNum::cmAlphaNum(&local_110,(char *)args_local);
  cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>(int&&,char_const(&)[3],char_const*&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_88,
             &cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>(int&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_110);
  cmAlphaNum::cmAlphaNum(&local_148,*(char **)args_local_1);
  cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>(int&&,char_const(&)[3],char_const*&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_70,
             &cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>(int&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_148);
  cmAlphaNum::cmAlphaNum(&local_180,*local_30);
  cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>(int&&,char_const(&)[3],char_const*&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_58,
             &cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>(int&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_180);
  local_40 = &local_a0;
  local_38 = 4;
  views._M_len = 4;
  views._M_array = local_40;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}